

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O0

void printBlock(char *banner,Integer type,void *ptr,Integer *lo,Integer *hi,Integer *ld)

{
  ulong uVar1;
  long lVar2;
  ulong *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ulong *in_R8;
  long *in_R9;
  Integer offset;
  Integer j;
  Integer i;
  Integer in_stack_00000148;
  char *in_stack_00000150;
  ulong local_40;
  ulong local_38;
  
  uVar1 = pnga_nodeid();
  printf("p[%d] %s lo[0]: %d hi[0]: %d lo[1]: %d hi[1]: %d\n",uVar1 & 0xffffffff,in_RDI,
         *in_RCX & 0xffffffff,*in_R8 & 0xffffffff,in_RCX[1] & 0xffffffff,(int)in_R8[1]);
  printf("    ");
  for (local_38 = *in_RCX; (long)local_38 <= (long)*in_R8; local_38 = local_38 + 1) {
    printf(" %12d",local_38 & 0xffffffff);
  }
  printf("\n");
  for (local_40 = in_RCX[1]; (long)local_40 <= (long)in_R8[1]; local_40 = local_40 + 1) {
    printf("J: %d",local_40 & 0xffffffff);
    for (local_38 = *in_RCX; (long)local_38 <= (long)*in_R8; local_38 = local_38 + 1) {
      lVar2 = ((local_40 - in_RCX[1]) * *in_R9 + local_38) - *in_RCX;
      switch(in_RSI) {
      case 0x3eb:
        printf(" %12.4f",(double)*(float *)(in_RDX + lVar2 * 4));
        break;
      case 0x3ec:
        printf(" %12.4f",*(undefined8 *)(in_RDX + lVar2 * 8));
        break;
      default:
        pnga_error(in_stack_00000150,in_stack_00000148);
        break;
      case 0x3ee:
        printf(" [%12.4f:%12.4f]",(double)*(float *)(in_RDX + lVar2 * 8),
               (double)*(float *)(in_RDX + 4 + lVar2 * 8));
        break;
      case 0x3ef:
        printf(" [%12.4f:%12.4f]",*(undefined8 *)(in_RDX + lVar2 * 0x10),
               *(undefined8 *)(in_RDX + 8 + lVar2 * 0x10));
      }
    }
    printf("\n");
  }
  printf("\n\n");
  return;
}

Assistant:

void printBlock(char * banner, Integer type, void *ptr, Integer lo[],
    Integer hi[], Integer ld[])
{
  Integer i,j;
  Integer offset;
  printf("p[%d] %s lo[0]: %d hi[0]: %d lo[1]: %d hi[1]: %d\n",
      (int)pnga_nodeid(),banner,(int)lo[0],(int)hi[0],(int)lo[1],(int)hi[1]);
  printf("    ");
  for (i=lo[0]; i<=hi[0]; i++) printf(" %12d",(int)i);
  printf("\n");
  for (j=lo[1]; j<=hi[1]; j++) {
    printf("J: %d",(int)j);
    for (i=lo[0]; i<=hi[0]; i++) {
      offset = (j-lo[1])*ld[0] + i-lo[0];
      switch (type) {
        case C_FLOAT:
          printf(" %12.4f",*((float*)ptr+offset));
          break;
        case C_DBL:
          printf(" %12.4f",*((double*)ptr+offset));
          break;
        case C_DCPL:
          printf(" [%12.4f:%12.4f]",*((double*)ptr+2*offset),
              *((double*)ptr+2*offset+1));
          break;
        case C_SCPL:
          printf(" [%12.4f:%12.4f]",*((float*)ptr+2*offset),
              *((float*)ptr+2*offset+1));
          break;
        default:
          pnga_error("ga_matmul_basic: wrong data type", type);
      }
    }
    printf("\n");
  }
  printf("\n\n");
}